

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_exception.h
# Opt level: O1

string * __thiscall
cfd::core::CfdException::GetErrorType_abi_cxx11_(string *__return_storage_ptr__,CfdException *this)

{
  pointer pcVar1;
  char *pcVar2;
  int iVar3;
  mapped_type *pmVar4;
  long lVar5;
  initializer_list<std::pair<const_cfd::core::CfdError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  allocator_type local_1da;
  less<cfd::core::CfdError> local_1d9;
  anon_enum_32 local_1d8 [10];
  pair<const_cfd::core::CfdError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1b0;
  pair<const_cfd::core::CfdError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_188;
  pair<const_cfd::core::CfdError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_160;
  pair<const_cfd::core::CfdError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_138;
  pair<const_cfd::core::CfdError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_110;
  pair<const_cfd::core::CfdError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e8;
  pair<const_cfd::core::CfdError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c0;
  pair<const_cfd::core::CfdError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  pair<const_cfd::core::CfdError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  pair<const_cfd::core::CfdError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  
  if (GetErrorType[abi:cxx11]()::kErrorTypeMap_abi_cxx11_ == '\0') {
    iVar3 = __cxa_guard_acquire(&GetErrorType[abi:cxx11]()::kErrorTypeMap_abi_cxx11_);
    if (iVar3 != 0) {
      local_1d8[9] = 0;
      ::std::
      pair<const_cfd::core::CfdError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<cfd::core::CfdError,_const_char_(&)[22],_true>
                (&local_1b0,local_1d8 + 9,(char (*) [22])"successful_completion");
      local_1d8[8] = 0xffffffff;
      ::std::
      pair<const_cfd::core::CfdError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<cfd::core::CfdError,_const_char_(&)[14],_true>
                (&local_188,local_1d8 + 8,(char (*) [14])"unknown_error");
      local_1d8[7] = 0xfffffffe;
      ::std::
      pair<const_cfd::core::CfdError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<cfd::core::CfdError,_const_char_(&)[15],_true>
                (&local_160,local_1d8 + 7,(char (*) [15])"internal_error");
      local_1d8[6] = 0xfffffffd;
      ::std::
      pair<const_cfd::core::CfdError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<cfd::core::CfdError,_const_char_(&)[12],_true>
                (&local_138,local_1d8 + 6,(char (*) [12])"memory_full");
      local_1d8[5] = 1;
      ::std::
      pair<const_cfd::core::CfdError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<cfd::core::CfdError,_const_char_(&)[17],_true>
                (&local_110,local_1d8 + 5,(char (*) [17])"illegal_argument");
      local_1d8[4] = 2;
      ::std::
      pair<const_cfd::core::CfdError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<cfd::core::CfdError,_const_char_(&)[14],_true>
                (&local_e8,local_1d8 + 4,(char (*) [14])"illegal_state");
      local_1d8[3] = 3;
      ::std::
      pair<const_cfd::core::CfdError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<cfd::core::CfdError,_const_char_(&)[13],_true>
                (&local_c0,local_1d8 + 3,(char (*) [13])"out_of_range");
      local_1d8[2] = 4;
      ::std::
      pair<const_cfd::core::CfdError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<cfd::core::CfdError,_const_char_(&)[16],_true>
                (&local_98,local_1d8 + 2,(char (*) [16])"invalid_setting");
      local_1d8[1] = 5;
      ::std::
      pair<const_cfd::core::CfdError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<cfd::core::CfdError,_const_char_(&)[17],_true>
                (&local_70,local_1d8 + 1,(char (*) [17])"connection_error");
      local_1d8[0] = kCfdDiskAccessError;
      ::std::
      pair<const_cfd::core::CfdError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<cfd::core::CfdError,_const_char_(&)[18],_true>
                (&local_48,local_1d8,(char (*) [18])"disk_access_error");
      __l._M_len = 10;
      __l._M_array = &local_1b0;
      ::std::
      map<cfd::core::CfdError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<cfd::core::CfdError>,_std::allocator<std::pair<const_cfd::core::CfdError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::map(&GetErrorType[abi:cxx11]()::kErrorTypeMap_abi_cxx11_,__l,&local_1d9,&local_1da);
      lVar5 = 0;
      do {
        pcVar2 = *(char **)((long)&local_48.second._M_dataplus._M_p + lVar5);
        if (local_48.second.field_2._M_local_buf + lVar5 != pcVar2) {
          operator_delete(pcVar2);
        }
        lVar5 = lVar5 + -0x28;
      } while (lVar5 != -400);
      __cxa_atexit(::std::
                   map<cfd::core::CfdError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<cfd::core::CfdError>,_std::allocator<std::pair<const_cfd::core::CfdError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::~map,&GetErrorType[abi:cxx11]()::kErrorTypeMap_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&GetErrorType[abi:cxx11]()::kErrorTypeMap_abi_cxx11_);
    }
  }
  pmVar4 = ::std::
           map<cfd::core::CfdError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<cfd::core::CfdError>,_std::allocator<std::pair<const_cfd::core::CfdError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::at(&GetErrorType[abi:cxx11]()::kErrorTypeMap_abi_cxx11_,&this->error_code_);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (pmVar4->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + pmVar4->_M_string_length);
  return __return_storage_ptr__;
}

Assistant:

_GLIBCXX_TXN_SAFE_DYN
      _GLIBCXX_USE_NOEXCEPT {
    static const std::map<CfdError, std::string> kErrorTypeMap(
        {{kCfdSuccess, "successful_completion"},
         {kCfdUnknownError, "unknown_error"},
         {kCfdInternalError, "internal_error"},
         {kCfdMemoryFullError, "memory_full"},
         {kCfdIllegalArgumentError, "illegal_argument"},
         {kCfdIllegalStateError, "illegal_state"},
         {kCfdOutOfRangeError, "out_of_range"},
         {kCfdInvalidSettingError, "invalid_setting"},
         {kCfdConnectionError, "connection_error"},
         {kCfdDiskAccessError, "disk_access_error"}});
    return kErrorTypeMap.at(error_code_);
  }